

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Spatializer.cpp
# Opt level: O2

int Spatializer::DistanceAttenuationCallback
              (UnityAudioEffectState *state,float distanceIn,float attenuationIn,
              float *attenuationOut)

{
  EffectData *pEVar1;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<Spatializer::EffectData>(state);
  *attenuationOut =
       (1.0 / ((ABS(1.0 - distanceIn) + distanceIn + 1.0) * 0.5)) * pEVar1->p[2] +
       attenuationIn * pEVar1->p[0] + pEVar1->p[1];
  return 0;
}

Assistant:

static UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK DistanceAttenuationCallback(UnityAudioEffectState* state, float distanceIn, float attenuationIn, float* attenuationOut)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        *attenuationOut =
            data->p[P_AUDIOSRCATTN] * attenuationIn +
            data->p[P_FIXEDVOLUME] +
            data->p[P_CUSTOMFALLOFF] * (1.0f / FastMax(1.0f, distanceIn));
        return UNITY_AUDIODSP_OK;
    }